

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_buffer.cc
# Opt level: O3

void __thiscall bssl::SSLBuffer::Clear(SSLBuffer *this)

{
  if (this->buf_ != this->inline_buf_) {
    free(this->buf_);
  }
  *(undefined8 *)((long)&this->buf_ + 6) = 0;
  this->buf_ = (uint8_t *)0x0;
  return;
}

Assistant:

void SSLBuffer::Clear() {
  if (buf_ != inline_buf_) {
    free(buf_);  // Allocated with malloc().
  }
  buf_ = nullptr;
  offset_ = 0;
  size_ = 0;
  cap_ = 0;
}